

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Maybe<capnp::StructSchema::Field> * __thiscall
capnp::StructSchema::findFieldByName
          (Maybe<capnp::StructSchema::Field> *__return_storage_ptr__,StructSchema *this,
          StringPtr name)

{
  RawSchema *this_00;
  FieldList *in_R9;
  StringPtr name_00;
  FieldList local_70;
  RawSchema *local_38;
  char *local_30;
  StructSchema *local_28;
  StructSchema *this_local;
  StringPtr name_local;
  
  local_30 = (char *)name.content.size_;
  local_38 = (RawSchema *)name.content.ptr;
  this_00 = ((this->super_Schema).raw)->generic;
  local_28 = this;
  this_local = (StructSchema *)local_38;
  name_local.content.ptr = local_30;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  getFields(&local_70,this);
  name_00.content.size_ = (size_t)&local_70;
  name_00.content.ptr = local_30;
  anon_unknown_33::findSchemaMemberByName<capnp::StructSchema::FieldList>
            (__return_storage_ptr__,(anon_unknown_33 *)this_00,local_38,name_00,in_R9);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<StructSchema::Field> StructSchema::findFieldByName(kj::StringPtr name) const {
  return findSchemaMemberByName(raw->generic, name, getFields());
}